

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

logical pnga_update55_ghosts(Integer g_a)

{
  short sVar1;
  short sVar2;
  int iVar3;
  undefined4 uVar4;
  Integer IVar5;
  logical lVar6;
  long lVar7;
  void *__ptr;
  long *__ptr_00;
  size_t sVar8;
  Integer IVar9;
  long in_RDI;
  int _d_15;
  int _i_21;
  int _ndim_19;
  int _i_20;
  int _itmp_7;
  int _offset_7;
  int _ndim_18;
  int _i_19;
  int _index_15 [7];
  int _ndim_17;
  int _i_18;
  int _itmp_6;
  int _ndim_16;
  int _i_17;
  int _index_14 [7];
  int _ndim_15;
  int _i_16;
  Integer _dimpos_7;
  Integer _dimstart_7;
  Integer _dim_7;
  Integer _index_13;
  Integer _d_14;
  Integer _nb_7;
  Integer _loc_7;
  Integer _dimpos_6;
  Integer _dimstart_6;
  Integer _dim_6;
  Integer _index_12;
  Integer _d_13;
  Integer _nb_6;
  Integer _loc_6;
  Integer _hi_3 [7];
  Integer _lo_3 [7];
  Integer _offset_6;
  Integer _last_3;
  Integer _factor_3;
  Integer _d_12;
  int _ndim_14;
  int _i_15;
  int _itmp_5;
  int _offset_5;
  int _ndim_13;
  int _i_14;
  int _index_11 [7];
  int _ndim_12;
  int _i_13;
  int _itmp_4;
  int _ndim_11;
  int _i_12;
  int _index_10 [7];
  int _ndim_10;
  int _i_11;
  Integer _dimpos_5;
  Integer _dimstart_5;
  Integer _dim_5;
  Integer _index_9;
  Integer _d_11;
  Integer _nb_5;
  Integer _loc_5;
  Integer _dimpos_4;
  Integer _dimstart_4;
  Integer _dim_4;
  Integer _index_8;
  Integer _d_10;
  Integer _nb_4;
  Integer _loc_4;
  Integer _hi_2 [7];
  Integer _lo_2 [7];
  Integer _offset_4;
  Integer _last_2;
  Integer _factor_2;
  Integer _d_9;
  char err_string_1 [256];
  char *str_1;
  int _l_1;
  int _d_8;
  int _d_7;
  int _i_10;
  int _ndim_9;
  int _i_9;
  int _itmp_3;
  int _offset_3;
  int _ndim_8;
  int _i_8;
  int _index_7 [7];
  int _ndim_7;
  int _i_7;
  int _itmp_2;
  int _ndim_6;
  int _i_6;
  int _index_6 [7];
  int _ndim_5;
  int _i_5;
  Integer _dimpos_3;
  Integer _dimstart_3;
  Integer _dim_3;
  Integer _index_5;
  Integer _d_6;
  Integer _nb_3;
  Integer _loc_3;
  Integer _dimpos_2;
  Integer _dimstart_2;
  Integer _dim_2;
  Integer _index_4;
  Integer _d_5;
  Integer _nb_2;
  Integer _loc_2;
  Integer _hi_1 [7];
  Integer _lo_1 [7];
  Integer _offset_2;
  Integer _last_1;
  Integer _factor_1;
  Integer _d_4;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset_1;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_3;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_2;
  Integer _nb;
  Integer _loc;
  Integer _hi [7];
  Integer _lo [7];
  Integer _offset;
  Integer _last;
  Integer _factor;
  Integer _d_1;
  char err_string [256];
  char *str;
  int _l;
  int _d;
  Integer *_ga_proclist;
  Integer *_ga_map;
  Integer p_handle;
  Integer me;
  char *ptr_rem;
  char *ptr_loc;
  int msgcnt;
  int count [7];
  int stride_rem [7];
  int stride_loc [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer phi_rem [7];
  Integer plo_rem [7];
  Integer shi_rem [7];
  Integer slo_rem [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer plo_loc [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer dims [7];
  Integer width [7];
  Integer increment [7];
  Integer nwidth;
  Integer ndim;
  Integer size;
  Integer proc_rem;
  Integer handle;
  Integer np;
  Integer i;
  Integer idx;
  undefined4 in_stack_fffffffffffff338;
  int in_stack_fffffffffffff33c;
  Integer *in_stack_fffffffffffff340;
  int *in_stack_fffffffffffff348;
  void *in_stack_fffffffffffff350;
  int in_stack_fffffffffffff358;
  int in_stack_fffffffffffff35c;
  int in_stack_fffffffffffff360;
  int in_stack_fffffffffffff364;
  int in_stack_fffffffffffff368;
  int in_stack_fffffffffffff36c;
  int in_stack_fffffffffffff370;
  int in_stack_fffffffffffff374;
  int in_stack_fffffffffffff378;
  undefined4 local_c84;
  int in_stack_fffffffffffff380;
  int local_c68;
  int local_c64;
  int local_c5c;
  int local_c58 [10];
  int local_c30;
  int local_c2c;
  long local_c28;
  long local_c20;
  long local_c18;
  long local_c10;
  long local_c08;
  long local_c00;
  long local_bf8;
  long local_bf0;
  long local_be8;
  long local_be0;
  long local_bd8;
  long local_bd0;
  long local_bc8;
  long local_bc0;
  long local_bb8 [8];
  long local_b78 [7];
  long local_b40;
  long in_stack_fffffffffffff4c8;
  char *in_stack_fffffffffffff4d0;
  long local_b28;
  int local_b1c;
  int local_b18;
  int local_b14;
  int local_b0c;
  int local_b08 [7];
  int local_aec;
  int local_ae8;
  int local_ae4;
  int in_stack_fffffffffffff520;
  int in_stack_fffffffffffff524;
  int local_ad8 [10];
  int local_ab0;
  int local_aac;
  long local_aa8;
  long local_aa0;
  long local_a98;
  Integer local_a90;
  long local_a88;
  long local_a80;
  long local_a78;
  long local_a70;
  long local_a68;
  long local_a60;
  Integer local_a58;
  long local_a50;
  long local_a48;
  long local_a40;
  long local_a38 [8];
  long local_9f8 [6];
  Integer *in_stack_fffffffffffff638;
  Integer *in_stack_fffffffffffff640;
  long in_stack_fffffffffffff648;
  long in_stack_fffffffffffff650;
  long local_9a8;
  long local_9a0;
  char local_998 [256];
  char *local_898;
  int local_890;
  int local_88c;
  int local_888;
  int local_884;
  int local_880;
  int local_87c;
  int local_878;
  int local_874;
  int local_870;
  int local_86c;
  int local_868 [7];
  int local_84c;
  int local_848;
  int local_844;
  int local_840;
  int local_83c;
  int local_838 [10];
  int local_810;
  int local_80c;
  long local_808;
  long local_800;
  long local_7f8;
  long local_7f0;
  long local_7e8;
  long local_7e0;
  long local_7d8;
  long local_7d0;
  long local_7c8;
  long local_7c0;
  long local_7b8;
  long local_7b0;
  long local_7a8;
  long local_7a0;
  long local_798 [8];
  long local_758 [7];
  long local_720;
  long local_718;
  long local_710;
  long local_708;
  int local_700;
  int local_6fc;
  int local_6f8;
  int local_6f4;
  int local_6f0;
  int local_6ec;
  int local_6e8 [7];
  int local_6cc;
  int local_6c8;
  int local_6c4;
  int local_6c0;
  int local_6bc;
  int local_6b8 [10];
  int local_690;
  int local_68c;
  long local_688;
  long local_680;
  long local_678;
  Integer local_670;
  long local_668;
  long local_660;
  long local_658;
  long local_650;
  long local_648;
  long local_640;
  Integer local_638;
  long local_630;
  long local_628;
  long local_620;
  long local_618 [8];
  long local_5d8 [8];
  long local_598;
  long local_590;
  long local_588;
  long local_580;
  char local_578 [152];
  Integer *in_stack_fffffffffffffb20;
  Integer *in_stack_fffffffffffffb28;
  Integer *in_stack_fffffffffffffb30;
  Integer *in_stack_fffffffffffffb38;
  Integer *in_stack_fffffffffffffb40;
  Integer in_stack_fffffffffffffb48;
  int local_468;
  int local_464;
  int local_428 [8];
  int local_408 [8];
  int local_3e8 [8];
  long local_3c8 [8];
  long local_388 [8];
  long alStack_348 [8];
  long alStack_308 [8];
  undefined8 local_2c8 [8];
  undefined8 local_288 [8];
  long local_248 [8];
  long local_208 [8];
  Integer aIStack_1c8 [8];
  long local_188 [8];
  long local_148 [8];
  Integer local_108 [8];
  Integer local_c8 [8];
  long alStack_88 [7];
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_20;
  long local_18;
  Integer local_10;
  logical local_8;
  
  local_30 = in_RDI + 1000;
  local_10 = in_RDI;
  IVar5 = pnga_nodeid();
  lVar6 = pnga_has_ghosts(local_10);
  if (lVar6 == 0) {
    local_8 = 1;
  }
  else {
    local_40 = (long)GA[local_30].elemsize;
    local_48 = (long)GA[local_30].ndim;
    lVar7 = (long)GA[local_30].p_handle;
    for (local_18 = 0; local_18 < local_48; local_18 = local_18 + 1) {
      alStack_88[local_18] = 0;
      local_c8[local_18] = GA[local_30].width[local_18];
      local_108[local_18] = GA[local_30].dims[local_18];
      if ((local_148[local_18] == 0) && (local_188[local_18] == -1)) {
        return 0;
      }
    }
    lVar6 = gai_check_ghost_distr(local_10);
    if (lVar6 == 0) {
      local_8 = 0;
    }
    else {
      __ptr = malloc((GAnproc * 0xe + 1) * 8);
      if (__ptr == (void *)0x0) {
        pnga_error(in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
      }
      __ptr_00 = (long *)malloc(GAnproc << 3);
      if (__ptr_00 == (long *)0x0) {
        pnga_error(in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
      }
      pnga_distribution(in_stack_fffffffffffff650,in_stack_fffffffffffff648,
                        in_stack_fffffffffffff640,in_stack_fffffffffffff638);
      *GA_Update_Signal = 1;
      for (local_18 = 0; local_18 < local_48; local_18 = local_18 + 1) {
        local_50 = local_c8[local_18];
        if (local_50 != 0) {
          get_remote_block_neg
                    ((Integer)in_stack_fffffffffffff350,(Integer)in_stack_fffffffffffff348,
                     in_stack_fffffffffffff340,
                     (Integer *)CONCAT44(in_stack_fffffffffffff33c,in_stack_fffffffffffff338),
                     local_c8,local_108,
                     (Integer *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                     (Integer *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
          lVar6 = pnga_locate_region(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                                     in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                                     in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
          if (lVar6 == 0) {
            sprintf(local_578,"%s","cannot locate region: ");
            sVar8 = strlen("cannot locate region: ");
            sprintf(local_578 + (int)sVar8,"%s",GA[local_10 + 1000].name);
            sVar8 = strlen(local_578);
            sprintf(local_578 + (int)sVar8," [%ld:%ld ",local_288[0],local_2c8[0]);
            sVar8 = strlen(local_578);
            local_468 = (int)sVar8;
            local_464 = 1;
            while( true ) {
              in_stack_fffffffffffff350 = (void *)(long)local_464;
              IVar9 = pnga_ndim(CONCAT44(in_stack_fffffffffffff524,in_stack_fffffffffffff520));
              if (IVar9 <= (long)in_stack_fffffffffffff350) break;
              sprintf(local_578 + local_468,",%ld:%ld ",local_288[local_464],local_2c8[local_464]);
              sVar8 = strlen(local_578);
              local_468 = (int)sVar8;
              local_464 = local_464 + 1;
            }
            sprintf(local_578 + local_468,"%s","]");
            strlen(local_578);
            pnga_error(in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
          }
          local_38 = *__ptr_00;
          pnga_distribution(in_stack_fffffffffffff650,in_stack_fffffffffffff648,
                            in_stack_fffffffffffff640,in_stack_fffffffffffff638);
          for (local_20 = 0; local_20 < local_48; local_20 = local_20 + 1) {
            if (alStack_88[local_20] == 0) {
              if (local_20 == local_18) {
                alStack_308[local_20] =
                     (local_248[local_20] - local_208[local_20]) + local_c8[local_20] + 1;
                alStack_348[local_20] =
                     (local_248[local_20] - local_208[local_20]) + local_c8[local_20] * 2;
                aIStack_1c8[local_20] = local_c8[local_20];
              }
              else {
                alStack_308[local_20] = local_c8[local_20];
                alStack_348[local_20] =
                     (local_248[local_20] - local_208[local_20]) + local_c8[local_20];
                aIStack_1c8[local_20] = local_c8[local_20];
              }
            }
            else {
              alStack_308[local_20] = 0;
              alStack_348[local_20] =
                   (local_248[local_20] - local_208[local_20]) + alStack_88[local_20];
              aIStack_1c8[local_20] = 0;
            }
          }
          local_588 = 1;
          local_590 = (long)(GA[local_30].ndim + -1);
          local_598 = 0;
          if (GA[local_30].distr_type == 0) {
            if (GA[local_30].num_rstrctd == 0) {
              local_640 = (long)GA[local_30].ndim;
              local_648 = 0;
              local_628 = 1;
              for (local_630 = 0; local_630 < local_640; local_630 = local_630 + 1) {
                local_628 = GA[local_30].nblock[local_630] * local_628;
              }
              if ((local_628 + -1 < IVar5) || (IVar5 < 0)) {
                for (local_630 = 0; local_630 < local_640; local_630 = local_630 + 1) {
                  local_5d8[local_630] = 0;
                  local_618[local_630] = -1;
                }
              }
              else {
                local_638 = IVar5;
                for (local_630 = 0; local_630 < local_640; local_630 = local_630 + 1) {
                  local_620 = local_638 % (long)GA[local_30].nblock[local_630];
                  local_638 = local_638 / (long)GA[local_30].nblock[local_630];
                  local_650 = local_620 + local_648;
                  local_648 = GA[local_30].nblock[local_630] + local_648;
                  local_5d8[local_630] = GA[local_30].mapc[local_650];
                  if (local_620 == GA[local_30].nblock[local_630] + -1) {
                    local_618[local_630] = GA[local_30].dims[local_630];
                  }
                  else {
                    local_618[local_630] = GA[local_30].mapc[local_650 + 1] + -1;
                  }
                }
              }
            }
            else if (IVar5 < GA[local_30].num_rstrctd) {
              local_678 = (long)GA[local_30].ndim;
              local_680 = 0;
              local_660 = 1;
              for (local_668 = 0; local_668 < local_678; local_668 = local_668 + 1) {
                local_660 = GA[local_30].nblock[local_668] * local_660;
              }
              if ((local_660 + -1 < IVar5) || (IVar5 < 0)) {
                for (local_668 = 0; local_668 < local_678; local_668 = local_668 + 1) {
                  local_5d8[local_668] = 0;
                  local_618[local_668] = -1;
                }
              }
              else {
                local_670 = IVar5;
                for (local_668 = 0; local_668 < local_678; local_668 = local_668 + 1) {
                  local_658 = local_670 % (long)GA[local_30].nblock[local_668];
                  local_670 = local_670 / (long)GA[local_30].nblock[local_668];
                  local_688 = local_658 + local_680;
                  local_680 = GA[local_30].nblock[local_668] + local_680;
                  local_5d8[local_668] = GA[local_30].mapc[local_688];
                  if (local_658 == GA[local_30].nblock[local_668] + -1) {
                    local_618[local_668] = GA[local_30].dims[local_668];
                  }
                  else {
                    local_618[local_668] = GA[local_30].mapc[local_688 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar1 = GA[local_30].ndim;
              local_690 = (int)sVar1;
              for (local_68c = 0; local_68c < sVar1; local_68c = local_68c + 1) {
                local_5d8[local_68c] = 0;
                local_618[local_68c] = -1;
              }
            }
          }
          else {
            iVar3 = (int)IVar5;
            if (((GA[local_30].distr_type == 1) || (GA[local_30].distr_type == 2)) ||
               (GA[local_30].distr_type == 3)) {
              sVar1 = GA[local_30].ndim;
              local_6c0 = (int)sVar1;
              sVar2 = GA[local_30].ndim;
              local_6cc = (int)sVar2;
              local_6c4 = iVar3;
              local_6b8[0] = (int)((long)iVar3 % GA[local_30].num_blocks[0]);
              for (local_6c8 = 1; local_6c8 < sVar2; local_6c8 = local_6c8 + 1) {
                local_6c4 = (int)((long)(local_6c4 - local_6b8[local_6c8 + -1]) /
                                 GA[local_30].num_blocks[local_6c8 + -1]);
                local_6b8[local_6c8] = (int)((long)local_6c4 % GA[local_30].num_blocks[local_6c8]);
              }
              for (local_6bc = 0; local_6bc < sVar1; local_6bc = local_6bc + 1) {
                local_5d8[local_6bc] =
                     (long)local_6b8[local_6bc] * GA[local_30].block_dims[local_6bc] + 1;
                local_618[local_6bc] =
                     (long)(local_6b8[local_6bc] + 1) * GA[local_30].block_dims[local_6bc];
                if (GA[local_30].dims[local_6bc] < local_618[local_6bc]) {
                  local_618[local_6bc] = GA[local_30].dims[local_6bc];
                }
              }
            }
            else if (GA[local_30].distr_type == 4) {
              sVar1 = GA[local_30].ndim;
              local_6f0 = (int)sVar1;
              local_6f4 = 0;
              sVar2 = GA[local_30].ndim;
              local_700 = (int)sVar2;
              local_6f8 = iVar3;
              local_6e8[0] = (int)((long)iVar3 % GA[local_30].num_blocks[0]);
              for (local_6fc = 1; local_6fc < sVar2; local_6fc = local_6fc + 1) {
                local_6f8 = (int)((long)(local_6f8 - local_6e8[local_6fc + -1]) /
                                 GA[local_30].num_blocks[local_6fc + -1]);
                local_6e8[local_6fc] = (int)((long)local_6f8 % GA[local_30].num_blocks[local_6fc]);
              }
              for (local_6ec = 0; local_6ec < sVar1; local_6ec = local_6ec + 1) {
                local_5d8[local_6ec] = GA[local_30].mapc[local_6f4 + local_6e8[local_6ec]];
                if ((long)local_6e8[local_6ec] < GA[local_30].num_blocks[local_6ec] + -1) {
                  local_618[local_6ec] =
                       GA[local_30].mapc[local_6f4 + local_6e8[local_6ec] + 1] + -1;
                }
                else {
                  local_618[local_6ec] = GA[local_30].dims[local_6ec];
                }
                local_6f4 = local_6f4 + (int)GA[local_30].num_blocks[local_6ec];
              }
            }
          }
          if (local_590 == 0) {
            local_388[0] = (local_618[0] - local_5d8[0]) + 1 + GA[local_30].width[0] * 2;
          }
          for (local_580 = 0; local_580 < local_590; local_580 = local_580 + 1) {
            local_598 = aIStack_1c8[local_580] * local_588 + local_598;
            local_388[local_580] =
                 (local_618[local_580] - local_5d8[local_580]) + 1 +
                 GA[local_30].width[local_580] * 2;
            local_588 = local_388[local_580] * local_588;
          }
          local_598 = aIStack_1c8[local_590] * local_588 + local_598;
          local_710 = 1;
          local_718 = (long)(GA[local_30].ndim + -1);
          local_720 = 0;
          if (GA[local_30].distr_type == 0) {
            if (GA[local_30].num_rstrctd == 0) {
              local_7c0 = (long)GA[local_30].ndim;
              local_7c8 = 0;
              local_7a8 = 1;
              for (local_7b0 = 0; local_7b0 < local_7c0; local_7b0 = local_7b0 + 1) {
                local_7a8 = GA[local_30].nblock[local_7b0] * local_7a8;
              }
              if ((local_7a8 + -1 < local_38) || (local_38 < 0)) {
                for (local_7b0 = 0; local_7b0 < local_7c0; local_7b0 = local_7b0 + 1) {
                  local_758[local_7b0] = 0;
                  local_798[local_7b0] = -1;
                }
              }
              else {
                local_7b8 = local_38;
                for (local_7b0 = 0; local_7b0 < local_7c0; local_7b0 = local_7b0 + 1) {
                  local_7a0 = local_7b8 % (long)GA[local_30].nblock[local_7b0];
                  local_7b8 = local_7b8 / (long)GA[local_30].nblock[local_7b0];
                  local_7d0 = local_7a0 + local_7c8;
                  local_7c8 = GA[local_30].nblock[local_7b0] + local_7c8;
                  local_758[local_7b0] = GA[local_30].mapc[local_7d0];
                  if (local_7a0 == GA[local_30].nblock[local_7b0] + -1) {
                    local_798[local_7b0] = GA[local_30].dims[local_7b0];
                  }
                  else {
                    local_798[local_7b0] = GA[local_30].mapc[local_7d0 + 1] + -1;
                  }
                }
              }
            }
            else if (local_38 < GA[local_30].num_rstrctd) {
              local_7f8 = (long)GA[local_30].ndim;
              local_800 = 0;
              local_7e0 = 1;
              for (local_7e8 = 0; local_7e8 < local_7f8; local_7e8 = local_7e8 + 1) {
                local_7e0 = GA[local_30].nblock[local_7e8] * local_7e0;
              }
              if ((local_7e0 + -1 < local_38) || (local_38 < 0)) {
                for (local_7e8 = 0; local_7e8 < local_7f8; local_7e8 = local_7e8 + 1) {
                  local_758[local_7e8] = 0;
                  local_798[local_7e8] = -1;
                }
              }
              else {
                local_7f0 = local_38;
                for (local_7e8 = 0; local_7e8 < local_7f8; local_7e8 = local_7e8 + 1) {
                  local_7d8 = local_7f0 % (long)GA[local_30].nblock[local_7e8];
                  local_7f0 = local_7f0 / (long)GA[local_30].nblock[local_7e8];
                  local_808 = local_7d8 + local_800;
                  local_800 = GA[local_30].nblock[local_7e8] + local_800;
                  local_758[local_7e8] = GA[local_30].mapc[local_808];
                  if (local_7d8 == GA[local_30].nblock[local_7e8] + -1) {
                    local_798[local_7e8] = GA[local_30].dims[local_7e8];
                  }
                  else {
                    local_798[local_7e8] = GA[local_30].mapc[local_808 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar1 = GA[local_30].ndim;
              local_810 = (int)sVar1;
              for (local_80c = 0; local_80c < sVar1; local_80c = local_80c + 1) {
                local_758[local_80c] = 0;
                local_798[local_80c] = -1;
              }
            }
          }
          else {
            iVar3 = (int)local_38;
            if (((GA[local_30].distr_type == 1) || (GA[local_30].distr_type == 2)) ||
               (GA[local_30].distr_type == 3)) {
              sVar1 = GA[local_30].ndim;
              local_840 = (int)sVar1;
              sVar2 = GA[local_30].ndim;
              local_84c = (int)sVar2;
              local_844 = iVar3;
              local_838[0] = (int)((long)iVar3 % GA[local_30].num_blocks[0]);
              for (local_848 = 1; local_848 < sVar2; local_848 = local_848 + 1) {
                local_844 = (int)((long)(local_844 - local_838[local_848 + -1]) /
                                 GA[local_30].num_blocks[local_848 + -1]);
                local_838[local_848] = (int)((long)local_844 % GA[local_30].num_blocks[local_848]);
              }
              for (local_83c = 0; local_83c < sVar1; local_83c = local_83c + 1) {
                local_758[local_83c] =
                     (long)local_838[local_83c] * GA[local_30].block_dims[local_83c] + 1;
                local_798[local_83c] =
                     (long)(local_838[local_83c] + 1) * GA[local_30].block_dims[local_83c];
                if (GA[local_30].dims[local_83c] < local_798[local_83c]) {
                  local_798[local_83c] = GA[local_30].dims[local_83c];
                }
              }
            }
            else if (GA[local_30].distr_type == 4) {
              sVar1 = GA[local_30].ndim;
              local_870 = (int)sVar1;
              local_874 = 0;
              sVar2 = GA[local_30].ndim;
              local_880 = (int)sVar2;
              local_878 = iVar3;
              local_868[0] = (int)((long)iVar3 % GA[local_30].num_blocks[0]);
              for (local_87c = 1; local_87c < sVar2; local_87c = local_87c + 1) {
                local_878 = (int)((long)(local_878 - local_868[local_87c + -1]) /
                                 GA[local_30].num_blocks[local_87c + -1]);
                local_868[local_87c] = (int)((long)local_878 % GA[local_30].num_blocks[local_87c]);
              }
              for (local_86c = 0; local_86c < sVar1; local_86c = local_86c + 1) {
                local_758[local_86c] = GA[local_30].mapc[local_874 + local_868[local_86c]];
                if ((long)local_868[local_86c] < GA[local_30].num_blocks[local_86c] + -1) {
                  local_798[local_86c] =
                       GA[local_30].mapc[local_874 + local_868[local_86c] + 1] + -1;
                }
                else {
                  local_798[local_86c] = GA[local_30].dims[local_86c];
                }
                local_874 = local_874 + (int)GA[local_30].num_blocks[local_86c];
              }
            }
          }
          if (local_718 == 0) {
            local_3c8[0] = (local_798[0] - local_758[0]) + 1 + GA[local_30].width[0] * 2;
          }
          for (local_708 = 0; local_708 < local_718; local_708 = local_708 + 1) {
            local_720 = alStack_308[local_708] * local_710 + local_720;
            local_3c8[local_708] =
                 (local_798[local_708] - local_758[local_708]) + 1 +
                 GA[local_30].width[local_708] * 2;
            local_710 = local_3c8[local_708] * local_710;
          }
          local_720 = alStack_308[local_718] * local_710 + local_720;
          local_3e8[0] = (int)local_40;
          local_408[0] = (int)local_40;
          for (local_884 = 0; (long)local_884 < local_48 + -1; local_884 = local_884 + 1) {
            local_408[local_884] = (int)local_3c8[local_884] * local_408[local_884];
            local_3e8[local_884] = (int)local_388[local_884] * local_3e8[local_884];
            local_408[local_884 + 1] = local_408[local_884];
            local_3e8[local_884 + 1] = local_3e8[local_884];
          }
          for (local_888 = 0; local_888 < local_48; local_888 = local_888 + 1) {
            local_428[local_888] = ((int)alStack_348[local_888] - (int)alStack_308[local_888]) + 1;
          }
          local_428[0] = local_428[0] * (int)local_40;
          if (-1 < lVar7) {
            local_38 = (long)PGRP_LIST[lVar7].inv_map_proc_list[local_38];
          }
          uVar4 = (undefined4)local_38;
          ARMCI_PutS_flag((void *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                          (int *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
                          in_stack_fffffffffffff350,in_stack_fffffffffffff348,
                          (int *)in_stack_fffffffffffff340,in_stack_fffffffffffff33c,
                          (int *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                          in_stack_fffffffffffff378,in_stack_fffffffffffff380);
          get_remote_block_pos
                    ((Integer)in_stack_fffffffffffff350,(Integer)in_stack_fffffffffffff348,
                     in_stack_fffffffffffff340,(Integer *)CONCAT44(in_stack_fffffffffffff33c,uVar4),
                     local_c8,local_108,
                     (Integer *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                     (Integer *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
          lVar6 = pnga_locate_region(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                                     in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                                     in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
          if (lVar6 == 0) {
            local_898 = "cannot locate region: ";
            sprintf(local_998,"%s","cannot locate region: ");
            local_88c = 0;
            sVar8 = strlen(local_898);
            local_890 = (int)sVar8;
            sprintf(local_998 + local_890,"%s",GA[local_10 + 1000].name);
            sVar8 = strlen(local_998);
            local_890 = (int)sVar8;
            sprintf(local_998 + (int)sVar8," [%ld:%ld ",local_288[local_88c],local_2c8[local_88c]);
            sVar8 = strlen(local_998);
            local_890 = (int)sVar8;
            local_88c = 1;
            while( true ) {
              in_stack_fffffffffffff348 = (int *)(long)local_88c;
              IVar9 = pnga_ndim(CONCAT44(in_stack_fffffffffffff524,in_stack_fffffffffffff520));
              if (IVar9 <= (long)in_stack_fffffffffffff348) break;
              sprintf(local_998 + local_890,",%ld:%ld ",local_288[local_88c],local_2c8[local_88c]);
              sVar8 = strlen(local_998);
              local_890 = (int)sVar8;
              local_88c = local_88c + 1;
            }
            sprintf(local_998 + local_890,"%s","]");
            sVar8 = strlen(local_998);
            local_890 = (int)sVar8;
            pnga_error(in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
          }
          local_38 = *__ptr_00;
          pnga_distribution(in_stack_fffffffffffff650,in_stack_fffffffffffff648,
                            in_stack_fffffffffffff640,in_stack_fffffffffffff638);
          for (local_20 = 0; local_20 < local_48; local_20 = local_20 + 1) {
            if (alStack_88[local_20] == 0) {
              if (local_20 == local_18) {
                alStack_308[local_20] = 0;
                alStack_348[local_20] = local_c8[local_20] + -1;
                aIStack_1c8[local_20] =
                     (local_188[local_20] - local_148[local_20]) + local_c8[local_20] + -1;
              }
              else {
                alStack_308[local_20] = local_c8[local_20];
                alStack_348[local_20] =
                     (local_248[local_20] - local_208[local_20]) + local_c8[local_20];
                aIStack_1c8[local_20] = local_c8[local_20];
              }
            }
            else {
              alStack_308[local_20] = 0;
              alStack_348[local_20] =
                   (local_248[local_20] - local_208[local_20]) + alStack_88[local_20];
              aIStack_1c8[local_20] = 0;
            }
          }
          local_9a8 = 1;
          in_stack_fffffffffffff650 = (long)(GA[local_30].ndim + -1);
          in_stack_fffffffffffff648 = 0;
          if (GA[local_30].distr_type == 0) {
            if (GA[local_30].num_rstrctd == 0) {
              local_a60 = (long)GA[local_30].ndim;
              local_a68 = 0;
              local_a48 = 1;
              for (local_a50 = 0; local_a50 < local_a60; local_a50 = local_a50 + 1) {
                local_a48 = GA[local_30].nblock[local_a50] * local_a48;
              }
              if ((local_a48 + -1 < GAme) || (GAme < 0)) {
                for (local_a50 = 0; local_a50 < local_a60; local_a50 = local_a50 + 1) {
                  local_9f8[local_a50] = 0;
                  local_a38[local_a50] = -1;
                }
              }
              else {
                local_a58 = GAme;
                for (local_a50 = 0; local_a50 < local_a60; local_a50 = local_a50 + 1) {
                  local_a40 = local_a58 % (long)GA[local_30].nblock[local_a50];
                  local_a58 = local_a58 / (long)GA[local_30].nblock[local_a50];
                  local_a70 = local_a40 + local_a68;
                  local_a68 = GA[local_30].nblock[local_a50] + local_a68;
                  local_9f8[local_a50] = GA[local_30].mapc[local_a70];
                  if (local_a40 == GA[local_30].nblock[local_a50] + -1) {
                    local_a38[local_a50] = GA[local_30].dims[local_a50];
                  }
                  else {
                    local_a38[local_a50] = GA[local_30].mapc[local_a70 + 1] + -1;
                  }
                }
              }
            }
            else if (GAme < GA[local_30].num_rstrctd) {
              local_a98 = (long)GA[local_30].ndim;
              local_aa0 = 0;
              local_a80 = 1;
              for (local_a88 = 0; local_a88 < local_a98; local_a88 = local_a88 + 1) {
                local_a80 = GA[local_30].nblock[local_a88] * local_a80;
              }
              if ((local_a80 + -1 < GAme) || (GAme < 0)) {
                for (local_a88 = 0; local_a88 < local_a98; local_a88 = local_a88 + 1) {
                  local_9f8[local_a88] = 0;
                  local_a38[local_a88] = -1;
                }
              }
              else {
                local_a90 = GAme;
                for (local_a88 = 0; local_a88 < local_a98; local_a88 = local_a88 + 1) {
                  local_a78 = local_a90 % (long)GA[local_30].nblock[local_a88];
                  local_a90 = local_a90 / (long)GA[local_30].nblock[local_a88];
                  local_aa8 = local_a78 + local_aa0;
                  local_aa0 = GA[local_30].nblock[local_a88] + local_aa0;
                  local_9f8[local_a88] = GA[local_30].mapc[local_aa8];
                  if (local_a78 == GA[local_30].nblock[local_a88] + -1) {
                    local_a38[local_a88] = GA[local_30].dims[local_a88];
                  }
                  else {
                    local_a38[local_a88] = GA[local_30].mapc[local_aa8 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar1 = GA[local_30].ndim;
              local_ab0 = (int)sVar1;
              for (local_aac = 0; local_aac < sVar1; local_aac = local_aac + 1) {
                local_9f8[local_aac] = 0;
                local_a38[local_aac] = -1;
              }
            }
          }
          else {
            local_b18 = (int)GAme;
            if (((GA[local_30].distr_type == 1) || (GA[local_30].distr_type == 2)) ||
               (GA[local_30].distr_type == 3)) {
              in_stack_fffffffffffff520 = (int)GA[local_30].ndim;
              sVar1 = GA[local_30].ndim;
              local_aec = (int)sVar1;
              local_ae4 = local_b18;
              local_ad8[0] = (int)((long)local_b18 % GA[local_30].num_blocks[0]);
              for (local_ae8 = 1; local_ae8 < sVar1; local_ae8 = local_ae8 + 1) {
                local_ae4 = (int)((long)(local_ae4 - local_ad8[local_ae8 + -1]) /
                                 GA[local_30].num_blocks[local_ae8 + -1]);
                local_ad8[local_ae8] = (int)((long)local_ae4 % GA[local_30].num_blocks[local_ae8]);
              }
              for (in_stack_fffffffffffff524 = 0;
                  in_stack_fffffffffffff524 < in_stack_fffffffffffff520;
                  in_stack_fffffffffffff524 = in_stack_fffffffffffff524 + 1) {
                local_9f8[in_stack_fffffffffffff524] =
                     (long)local_ad8[in_stack_fffffffffffff524] *
                     GA[local_30].block_dims[in_stack_fffffffffffff524] + 1;
                local_a38[in_stack_fffffffffffff524] =
                     (long)(local_ad8[in_stack_fffffffffffff524] + 1) *
                     GA[local_30].block_dims[in_stack_fffffffffffff524];
                if (GA[local_30].dims[in_stack_fffffffffffff524] <
                    local_a38[in_stack_fffffffffffff524]) {
                  local_a38[in_stack_fffffffffffff524] =
                       GA[local_30].dims[in_stack_fffffffffffff524];
                }
              }
            }
            else if (GA[local_30].distr_type == 4) {
              sVar1 = GA[local_30].ndim;
              local_b14 = 0;
              sVar2 = GA[local_30].ndim;
              local_b08[0] = (int)((long)local_b18 % GA[local_30].num_blocks[0]);
              for (local_b1c = 1; local_b1c < sVar2; local_b1c = local_b1c + 1) {
                local_b18 = (int)((long)(local_b18 - local_b08[local_b1c + -1]) /
                                 GA[local_30].num_blocks[local_b1c + -1]);
                local_b08[local_b1c] = (int)((long)local_b18 % GA[local_30].num_blocks[local_b1c]);
              }
              for (local_b0c = 0; local_b0c < sVar1; local_b0c = local_b0c + 1) {
                local_9f8[local_b0c] = GA[local_30].mapc[local_b14 + local_b08[local_b0c]];
                if ((long)local_b08[local_b0c] < GA[local_30].num_blocks[local_b0c] + -1) {
                  local_a38[local_b0c] =
                       GA[local_30].mapc[local_b14 + local_b08[local_b0c] + 1] + -1;
                }
                else {
                  local_a38[local_b0c] = GA[local_30].dims[local_b0c];
                }
                local_b14 = local_b14 + (int)GA[local_30].num_blocks[local_b0c];
              }
            }
          }
          if (in_stack_fffffffffffff650 == 0) {
            local_388[0] = (local_a38[0] - local_9f8[0]) + 1 + GA[local_30].width[0] * 2;
          }
          for (local_9a0 = 0; local_9a0 < in_stack_fffffffffffff650; local_9a0 = local_9a0 + 1) {
            in_stack_fffffffffffff648 =
                 aIStack_1c8[local_9a0] * local_9a8 + in_stack_fffffffffffff648;
            local_388[local_9a0] =
                 (local_a38[local_9a0] - local_9f8[local_9a0]) + 1 +
                 GA[local_30].width[local_9a0] * 2;
            local_9a8 = local_388[local_9a0] * local_9a8;
          }
          in_stack_fffffffffffff648 =
               aIStack_1c8[in_stack_fffffffffffff650] * local_9a8 + in_stack_fffffffffffff648;
          in_stack_fffffffffffff4d0 = (char *)0x1;
          in_stack_fffffffffffff4c8 = (long)(GA[local_30].ndim + -1);
          local_b40 = 0;
          if (GA[local_30].distr_type == 0) {
            if (GA[local_30].num_rstrctd == 0) {
              local_be0 = (long)GA[local_30].ndim;
              local_be8 = 0;
              local_bc8 = 1;
              for (local_bd0 = 0; local_bd0 < local_be0; local_bd0 = local_bd0 + 1) {
                local_bc8 = GA[local_30].nblock[local_bd0] * local_bc8;
              }
              if ((local_bc8 + -1 < local_38) || (local_38 < 0)) {
                for (local_bd0 = 0; local_bd0 < local_be0; local_bd0 = local_bd0 + 1) {
                  local_b78[local_bd0] = 0;
                  local_bb8[local_bd0] = -1;
                }
              }
              else {
                local_bd8 = local_38;
                for (local_bd0 = 0; local_bd0 < local_be0; local_bd0 = local_bd0 + 1) {
                  local_bc0 = local_bd8 % (long)GA[local_30].nblock[local_bd0];
                  local_bd8 = local_bd8 / (long)GA[local_30].nblock[local_bd0];
                  local_bf0 = local_bc0 + local_be8;
                  local_be8 = GA[local_30].nblock[local_bd0] + local_be8;
                  local_b78[local_bd0] = GA[local_30].mapc[local_bf0];
                  if (local_bc0 == GA[local_30].nblock[local_bd0] + -1) {
                    local_bb8[local_bd0] = GA[local_30].dims[local_bd0];
                  }
                  else {
                    local_bb8[local_bd0] = GA[local_30].mapc[local_bf0 + 1] + -1;
                  }
                }
              }
            }
            else if (local_38 < GA[local_30].num_rstrctd) {
              local_c18 = (long)GA[local_30].ndim;
              local_c20 = 0;
              local_c00 = 1;
              for (local_c08 = 0; local_c08 < local_c18; local_c08 = local_c08 + 1) {
                local_c00 = GA[local_30].nblock[local_c08] * local_c00;
              }
              if ((local_c00 + -1 < local_38) || (local_38 < 0)) {
                for (local_c08 = 0; local_c08 < local_c18; local_c08 = local_c08 + 1) {
                  local_b78[local_c08] = 0;
                  local_bb8[local_c08] = -1;
                }
              }
              else {
                local_c10 = local_38;
                for (local_c08 = 0; local_c08 < local_c18; local_c08 = local_c08 + 1) {
                  local_bf8 = local_c10 % (long)GA[local_30].nblock[local_c08];
                  local_c10 = local_c10 / (long)GA[local_30].nblock[local_c08];
                  local_c28 = local_bf8 + local_c20;
                  local_c20 = GA[local_30].nblock[local_c08] + local_c20;
                  local_b78[local_c08] = GA[local_30].mapc[local_c28];
                  if (local_bf8 == GA[local_30].nblock[local_c08] + -1) {
                    local_bb8[local_c08] = GA[local_30].dims[local_c08];
                  }
                  else {
                    local_bb8[local_c08] = GA[local_30].mapc[local_c28 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar1 = GA[local_30].ndim;
              local_c30 = (int)sVar1;
              for (local_c2c = 0; local_c2c < sVar1; local_c2c = local_c2c + 1) {
                local_b78[local_c2c] = 0;
                local_bb8[local_c2c] = -1;
              }
            }
          }
          else {
            local_c64 = (int)local_38;
            if (((GA[local_30].distr_type == 1) || (GA[local_30].distr_type == 2)) ||
               (GA[local_30].distr_type == 3)) {
              sVar1 = GA[local_30].ndim;
              sVar2 = GA[local_30].ndim;
              local_c58[0] = (int)((long)local_c64 % GA[local_30].num_blocks[0]);
              for (local_c68 = 1; local_c68 < sVar2; local_c68 = local_c68 + 1) {
                local_c64 = (int)((long)(local_c64 - local_c58[local_c68 + -1]) /
                                 GA[local_30].num_blocks[local_c68 + -1]);
                local_c58[local_c68] = (int)((long)local_c64 % GA[local_30].num_blocks[local_c68]);
              }
              for (local_c5c = 0; local_c5c < sVar1; local_c5c = local_c5c + 1) {
                local_b78[local_c5c] =
                     (long)local_c58[local_c5c] * GA[local_30].block_dims[local_c5c] + 1;
                local_bb8[local_c5c] =
                     (long)(local_c58[local_c5c] + 1) * GA[local_30].block_dims[local_c5c];
                if (GA[local_30].dims[local_c5c] < local_bb8[local_c5c]) {
                  local_bb8[local_c5c] = GA[local_30].dims[local_c5c];
                }
              }
            }
            else if (GA[local_30].distr_type == 4) {
              in_stack_fffffffffffff370 = (int)GA[local_30].ndim;
              in_stack_fffffffffffff36c = 0;
              in_stack_fffffffffffff360 = (int)GA[local_30].ndim;
              in_stack_fffffffffffff378 = (int)((long)local_c64 % GA[local_30].num_blocks[0]);
              for (in_stack_fffffffffffff364 = 1;
                  in_stack_fffffffffffff364 < in_stack_fffffffffffff360;
                  in_stack_fffffffffffff364 = in_stack_fffffffffffff364 + 1) {
                local_c64 = (int)((long)(local_c64 -
                                        *(int *)(&stack0xfffffffffffff378 +
                                                (long)(in_stack_fffffffffffff364 + -1) * 4)) /
                                 GA[local_30].num_blocks[in_stack_fffffffffffff364 + -1]);
                *(int *)(&stack0xfffffffffffff378 + (long)in_stack_fffffffffffff364 * 4) =
                     (int)((long)local_c64 % GA[local_30].num_blocks[in_stack_fffffffffffff364]);
              }
              for (in_stack_fffffffffffff374 = 0; in_stack_fffffffffffff368 = local_c64,
                  in_stack_fffffffffffff374 < in_stack_fffffffffffff370;
                  in_stack_fffffffffffff374 = in_stack_fffffffffffff374 + 1) {
                local_b78[in_stack_fffffffffffff374] =
                     GA[local_30].mapc
                     [in_stack_fffffffffffff36c +
                      *(int *)(&stack0xfffffffffffff378 + (long)in_stack_fffffffffffff374 * 4)];
                if ((long)*(int *)(&stack0xfffffffffffff378 + (long)in_stack_fffffffffffff374 * 4) <
                    GA[local_30].num_blocks[in_stack_fffffffffffff374] + -1) {
                  local_bb8[in_stack_fffffffffffff374] =
                       GA[local_30].mapc
                       [in_stack_fffffffffffff36c +
                        *(int *)(&stack0xfffffffffffff378 + (long)in_stack_fffffffffffff374 * 4) + 1
                       ] + -1;
                }
                else {
                  local_bb8[in_stack_fffffffffffff374] =
                       GA[local_30].dims[in_stack_fffffffffffff374];
                }
                in_stack_fffffffffffff36c =
                     in_stack_fffffffffffff36c +
                     (int)GA[local_30].num_blocks[in_stack_fffffffffffff374];
              }
            }
          }
          if (in_stack_fffffffffffff4c8 == 0) {
            local_3c8[0] = (local_bb8[0] - local_b78[0]) + 1 + GA[local_30].width[0] * 2;
          }
          for (local_b28 = 0; local_b28 < in_stack_fffffffffffff4c8; local_b28 = local_b28 + 1) {
            local_b40 = alStack_308[local_b28] * (long)in_stack_fffffffffffff4d0 + local_b40;
            local_3c8[local_b28] =
                 (local_bb8[local_b28] - local_b78[local_b28]) + 1 +
                 GA[local_30].width[local_b28] * 2;
            in_stack_fffffffffffff4d0 =
                 (char *)(local_3c8[local_b28] * (long)in_stack_fffffffffffff4d0);
          }
          local_b40 = alStack_308[in_stack_fffffffffffff4c8] * (long)in_stack_fffffffffffff4d0 +
                      local_b40;
          local_3e8[0] = (int)local_40;
          local_408[0] = (int)local_40;
          for (in_stack_fffffffffffff35c = 0; (long)in_stack_fffffffffffff35c < local_48 + -1;
              in_stack_fffffffffffff35c = in_stack_fffffffffffff35c + 1) {
            local_408[in_stack_fffffffffffff35c] =
                 (int)local_3c8[in_stack_fffffffffffff35c] * local_408[in_stack_fffffffffffff35c];
            local_3e8[in_stack_fffffffffffff35c] =
                 (int)local_388[in_stack_fffffffffffff35c] * local_3e8[in_stack_fffffffffffff35c];
            local_408[in_stack_fffffffffffff35c + 1] = local_408[in_stack_fffffffffffff35c];
            local_3e8[in_stack_fffffffffffff35c + 1] = local_3e8[in_stack_fffffffffffff35c];
          }
          for (in_stack_fffffffffffff358 = 0; in_stack_fffffffffffff358 < local_48;
              in_stack_fffffffffffff358 = in_stack_fffffffffffff358 + 1) {
            local_428[in_stack_fffffffffffff358] =
                 ((int)alStack_348[in_stack_fffffffffffff358] -
                 (int)alStack_308[in_stack_fffffffffffff358]) + 1;
          }
          local_428[0] = local_428[0] * (int)local_40;
          if (-1 < lVar7) {
            local_38 = (long)PGRP_LIST[lVar7].inv_map_proc_list[local_38];
          }
          in_stack_fffffffffffff338 = (undefined4)local_38;
          ARMCI_PutS_flag((void *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                          (int *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
                          in_stack_fffffffffffff350,in_stack_fffffffffffff348,
                          (int *)in_stack_fffffffffffff340,in_stack_fffffffffffff33c,
                          (int *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                          in_stack_fffffffffffff378,in_stack_fffffffffffff380);
        }
        waitforflags((int *)in_stack_fffffffffffff340,
                     (int *)CONCAT44(in_stack_fffffffffffff33c,in_stack_fffffffffffff338));
        alStack_88[local_18] = local_50 << 1;
      }
      for (local_18 = 0; SBORROW8(local_18,local_48 * 2) != local_18 + local_48 * -2 < 0;
          local_18 = local_18 + 1) {
        GA_Update_Flags[GAme][local_18] = 0;
      }
      free(__ptr);
      free(__ptr_00);
      local_8 = 1;
    }
  }
  return local_8;
}

Assistant:

logical pnga_update55_ghosts(Integer g_a)
{
  Integer idx, i, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer size, ndim, nwidth, increment[MAXDIM];
  Integer width[MAXDIM];
  Integer dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM]/*, phi_loc[MAXDIM]*/;
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer slo_rem[MAXDIM], shi_rem[MAXDIM];
  Integer plo_rem[MAXDIM], phi_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  int msgcnt;
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension.
   *
   * This operation is implemented using put calls to place the
   * appropriate data on remote processors. To signal the remote
   * processor that it has received the data, a second put call
   * consisting of a single integer is sent after the first put call and
   * used to update a signal buffer on the remote processor. Each
   * processor can determine how much data it has received by checking
   * its signal buffer. 
   *
   * To perform the update, this routine makes use of several copies of
   * indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rem[], hi_rem[]: The lower and upper indices of the block
   *       of data on a remote processor or processors that is needed to
   *       fill in the calling processors ghost cells. These indices are
   *       NOT corrected for wrap-around (periodic) boundary conditions
   *       so they can be negative or greater than the array dimension
   *       values held in dims[].
   *
   *       slo_rem[], shi_rem[]: Similar to lo_rem[] and hi_rem[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions. 
   *
   *       thi_rem[], thi_rem[]: The lower and upper indices of the visible
   *       data on a remote processor.
   *
   *       plo_loc[], phi_loc[]: The indices of the local data patch that
   *       is going to be updated.
   *
   *       plo_rem[], phi_rem[]: The indices of the data patch on the
   *       remote processor that will be used to update the data on the
   *       calling processor. Note that the dimensions of the patches
   *       represented by plo_loc[], plo_rem[] and plo_loc[], phi_loc[]
   *       must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;

  /* initialize range increments and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1) return FALSE;
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update55_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update55_ghosts:malloc failed (_ga_proclist)",0);

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[GAme];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* loop over dimensions for sequential update using shift algorithm */
  msgcnt = 0;
  (*GA_Update_Signal) = 1;
  for (idx=0; idx < ndim; idx++) {
    nwidth = width[idx];

    /* Do not bother with update if nwidth is zero */
    if (nwidth != 0) {

      /* Perform update in negative direction. */
      get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rem, shi_rem, g_a);

      /* Get actual coordinates of desired location of remote
         data as well as the actual coordinates of the local chunk
         of data that will be sent to remote processor (these
         coordinates take into account the presence of ghost
         cells). Start by finding out what data is actually held by
         remote processor. */
      proc_rem = _ga_proclist[0];
      pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_rem[i] = thi_rem[i] - tlo_rem[i] + width[i] + 1;
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + 2*width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = 2*width[i] - 1;*/
          } else {
            plo_rem[i] = width[i];
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
          }
        } else {
          plo_rem[i] = 0;
          phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
          plo_loc[i] = 0;
          /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
      gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

      /* Evaluate strides on local and remote processors */
      gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
          stride_loc);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rem, phi_rem, count);
      count[0] *= size;

      /* Put local data on remote processor */
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
#if 0
      ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count, ndim- 1, proc_rem);
      /* Send signal to remote processor that data transfer has been completed. */
      bytes = sizeof(int);
      ARMCI_Put(GA_Update_Signal, GA_Update_Flags[proc_rem]+msgcnt, bytes, proc_rem);
#else
      ARMCI_PutS_flag(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), GA_Update_Flags[proc_rem]+msgcnt,
          *GA_Update_Signal, (int)proc_rem);
#endif
      msgcnt++;

      /* Perform update in positive direction. */
      get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rem, shi_rem, g_a);

      /* Get actual coordinates of desired chunk of remote
         data as well as the actual coordinates of the local chunk
         of data that will receive the remote data (these
         coordinates take into account the presence of ghost
         cells). Start by finding out what data is actually held by
         remote processor. */
      proc_rem = _ga_proclist[0];
      pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_rem[i] = 0;
            phi_rem[i] = width[i] - 1;
            plo_loc[i] = hi_loc[i] - lo_loc[i] + width[i] - 1;
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + 2*width[i] - 1;*/
          } else {
            plo_rem[i] = width[i];
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
          }
        } else {
          plo_rem[i] = 0;
          phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
          plo_loc[i] = 0;
          /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(GAme, handle, plo_loc, &ptr_loc, ld_loc);
      gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

      /* Evaluate strides on local and remote processors */
      gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
          stride_loc);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rem, phi_rem, count);
      count[0] *= size;

      /* Put local data on remote processor */
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
#if 0
      ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count, ndim- 1, proc_rem);
      /* Send signal to remote processor that data transfer has been completed. */
      bytes = sizeof(int);
      ARMCI_Put(GA_Update_Signal, GA_Update_Flags[proc_rem]+msgcnt, bytes, proc_rem);

#else
      ARMCI_PutS_flag(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), GA_Update_Flags[proc_rem]+msgcnt,
          *GA_Update_Signal, (int)proc_rem);
#endif
      msgcnt++;
    }
    /* check to make sure that all messages have been recieved before
       starting update along new dimension */
    waitforflags((GA_Update_Flags[GAme]+msgcnt-2),
        (GA_Update_Flags[GAme]+msgcnt-1));
    /* update increment array */
    increment[idx] = 2*nwidth;
  }

  /* set GA_Update_Flags array to zero for next update operation. */
  for (idx=0; idx < 2*ndim; idx++) {
    GA_Update_Flags[GAme][idx] = 0;
  }

  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}